

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc_compat.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *__src;
  void *__dest;
  void *raw_buffer;
  void *buffer;
  size_t size;
  char **ppcStack_18;
  int ret;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if ((argc != 1) && (argc != 2)) {
    fprintf(_stderr,"wrong number of arguments:\nusage: <program> [<input-filename>]\n");
    exit(1);
  }
  if (argc == 2) {
    filename = argv[1];
  }
  __src = readfile(filename,0x400,(size_t *)&buffer);
  __dest = __portable_aligned_alloc(0x100,(long)buffer + 0xffU & 0xffffffffffffff00);
  memcpy(__dest,__src,(size_t)buffer);
  free(__src);
  if (__dest == (void *)0x0) {
    fprintf(_stderr,"could not read binary test file: %s\n",filename);
    argv_local._4_4_ = -1;
  }
  else {
    hexdump("monsterdata_test.mon",__dest,(size_t)buffer,(FILE *)_stderr);
    iVar1 = MyGame_Example_Monster_verify_as_root_with_identifier(__dest,(size_t)buffer,"MONS");
    if (iVar1 == 0) {
      iVar1 = MyGame_Example_Monster_verify_as_root(__dest,(size_t)buffer);
      if (iVar1 == 0) {
        size._4_4_ = verify_monster(__dest);
      }
      else {
        fprintf(_stderr,"could not verify foreign monster file with default identifier\n");
        size._4_4_ = -1;
      }
    }
    else {
      fprintf(_stderr,"could not verify foreign monster file\n");
      size._4_4_ = -1;
    }
    free(__dest);
    argv_local._4_4_ = size._4_4_;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    int ret;
    size_t size;
    void *buffer, *raw_buffer;

    if (argc != 1 && argc != 2) {
        fprintf(stderr, usage);
        exit(1);
    }
    if (argc == 2) {
        filename = argv[1];
    }

    raw_buffer = readfile(filename, 1024, &size);
    buffer = aligned_alloc(256, align_up(256, size));
    memcpy(buffer, raw_buffer, size);
    free(raw_buffer);

    if (!buffer) {
        fprintf(stderr, "could not read binary test file: %s\n", filename);
        return -1;
    }
    hexdump("monsterdata_test.mon", buffer, size, stderr);
    /*
     * Not automated, but verifying size - 3 fails as expected because the last
     * object in the file is a string, and the zero termination fails.
     * size - 1 and size - 2 verifies because the buffers contains
     * padding. Note that `flatcc` does not pad at the end beyond whatever
     * is stored (normally a vtable), but this is generated with `flatc
     * v1.1`.
     */
    if (flatcc_verify_ok != ns(Monster_verify_as_root_with_identifier(buffer, size, "MONS"))) {
#if FLATBUFFERS_PROTOCOL_IS_BE
        fprintf(stderr, "flatc golden reference buffer was correctly rejected by flatcc verificiation\n"
                "because flatc is little endian and flatcc has been compiled for big endian protocol format\n");
        ret = 0;
        goto done;
#else
        fprintf(stderr, "could not verify foreign monster file\n");
        ret = -1;
        goto done;
#endif
    }

#if FLATBUFFERS_PROTOCOL_IS_BE
    fprintf(stderr, "flatcc compiled with big endian protocol failed to reject reference little endian buffer\n");
    ret = -1;
    goto done;
#else
    if (flatcc_verify_ok != ns(Monster_verify_as_root(buffer, size))) {
        fprintf(stderr, "could not verify foreign monster file with default identifier\n");
        ret = -1;
        goto done;
    }
    ret = verify_monster(buffer);
#endif

done:
    aligned_free(buffer);
    return ret;
}